

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void yang_free_deviate(ly_ctx *ctx,lys_deviation *dev,uint index)

{
  lys_type *type;
  lys_deviate *plVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (index < dev->deviate_size) {
    uVar4 = (ulong)index;
    do {
      lydict_remove(ctx,dev->deviate[uVar4].units);
      type = dev->deviate[uVar4].type;
      if (type != (lys_type *)0x0) {
        yang_type_free(ctx,type);
      }
      plVar1 = dev->deviate;
      if (plVar1[uVar4].dflt_size != '\0') {
        uVar3 = 0;
        do {
          lydict_remove(ctx,plVar1[uVar4].dflt[uVar3]);
          uVar3 = uVar3 + 1;
          plVar1 = dev->deviate;
        } while (uVar3 < plVar1[uVar4].dflt_size);
      }
      free(plVar1[uVar4].dflt);
      plVar1 = dev->deviate;
      if (plVar1[uVar4].must_size != '\0') {
        lVar2 = 0;
        uVar3 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)((long)&(plVar1[uVar4].must)->expr + lVar2));
          uVar3 = uVar3 + 1;
          plVar1 = dev->deviate;
          lVar2 = lVar2 + 0x38;
        } while (uVar3 < plVar1[uVar4].must_size);
      }
      free(plVar1[uVar4].must);
      plVar1 = dev->deviate;
      if (plVar1[uVar4].unique_size != '\0') {
        lVar2 = 0;
        uVar3 = 0;
        do {
          free(*(void **)((long)&(plVar1[uVar4].unique)->expr + lVar2));
          uVar3 = uVar3 + 1;
          plVar1 = dev->deviate;
          lVar2 = lVar2 + 0x10;
        } while (uVar3 < plVar1[uVar4].unique_size);
      }
      free(plVar1[uVar4].unique);
      lys_extension_instances_free(ctx,dev->deviate[uVar4].ext,(uint)dev->deviate[uVar4].ext_size);
      uVar4 = uVar4 + 1;
    } while (uVar4 < dev->deviate_size);
  }
  return;
}

Assistant:

static void
yang_free_deviate(struct ly_ctx *ctx, struct lys_deviation *dev, uint index)
{
    uint i, j;

    for (i = index; i < dev->deviate_size; ++i) {
        lydict_remove(ctx, dev->deviate[i].units);

        if (dev->deviate[i].type) {
            yang_type_free(ctx, dev->deviate[i].type);
        }

        for (j = 0; j < dev->deviate[i].dflt_size; ++j) {
            lydict_remove(ctx, dev->deviate[i].dflt[j]);
        }
        free(dev->deviate[i].dflt);

        for (j = 0; j < dev->deviate[i].must_size; ++j) {
            lys_restr_free(ctx, &dev->deviate[i].must[j]);
        }
        free(dev->deviate[i].must);

        for (j = 0; j < dev->deviate[i].unique_size; ++j) {
            free(dev->deviate[i].unique[j].expr);
        }
        free(dev->deviate[i].unique);
        lys_extension_instances_free(ctx, dev->deviate[i].ext, dev->deviate[i].ext_size);
    }
}